

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

string * __thiscall
testing::internal::WideStringToUtf8_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,wchar_t *str,int num_chars)

{
  undefined1 *__return_storage_ptr___00;
  size_t sVar1;
  uint uVar2;
  uint32_t extraout_EDX;
  uint32_t code_point;
  uint32_t extraout_EDX_00;
  ulong uVar3;
  ulong uVar4;
  undefined1 local_1e0 [8];
  stringstream stream;
  
  uVar2 = (uint)str;
  if (uVar2 == 0xffffffff) {
    sVar1 = wcslen((wchar_t *)this);
    uVar2 = (uint)sVar1;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_1e0);
  uVar3 = 0;
  uVar4 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar4 = uVar3;
  }
  __return_storage_ptr___00 = &stream.field_0x180;
  code_point = extraout_EDX;
  for (; (uVar4 != uVar3 && (*(uint *)(this + uVar3 * 4) != 0)); uVar3 = uVar3 + 1) {
    CodePointToUtf8_abi_cxx11_
              ((string *)__return_storage_ptr___00,(internal *)(ulong)*(uint *)(this + uVar3 * 4),
               code_point);
    std::operator<<((ostream *)&stream.field_0x8,(string *)__return_storage_ptr___00);
    std::__cxx11::string::~string((string *)__return_storage_ptr___00);
    code_point = extraout_EDX_00;
  }
  StringStreamToString(__return_storage_ptr__,(stringstream *)local_1e0);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1e0);
  return __return_storage_ptr__;
}

Assistant:

std::string WideStringToUtf8(const wchar_t* str, int num_chars) {
  if (num_chars == -1)
    num_chars = static_cast<int>(wcslen(str));

  ::std::stringstream stream;
  for (int i = 0; i < num_chars; ++i) {
    uint32_t unicode_code_point;

    if (str[i] == L'\0') {
      break;
    } else if (i + 1 < num_chars && IsUtf16SurrogatePair(str[i], str[i + 1])) {
      unicode_code_point = CreateCodePointFromUtf16SurrogatePair(str[i],
                                                                 str[i + 1]);
      i++;
    } else {
      unicode_code_point = static_cast<uint32_t>(str[i]);
    }

    stream << CodePointToUtf8(unicode_code_point);
  }
  return StringStreamToString(&stream);
}